

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_debug.h
# Opt level: O0

bool immutable::validate_rrb<char,false,5>(ref<immutable::rrb<char,_false,_5>_> *rrb)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  bool bVar4;
  rrb<char,_false,_5> *prVar5;
  leaf_node<char,_false> *plVar6;
  rrb<char,_false,_5> *prVar7;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_20;
  ref<immutable::rrb_details::tree_node<char,_false>_> tail;
  ref<immutable::rrb<char,_false,_5>_> *rrb_local;
  
  tail.ptr = (tree_node<char,_false> *)rrb;
  prVar5 = ref<immutable::rrb<char,_false,_5>_>::operator->(rrb);
  plVar6 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&prVar5->tail);
  uVar1 = plVar6->len;
  prVar5 = ref<immutable::rrb<char,_false,_5>_>::operator->
                     ((ref<immutable::rrb<char,_false,_5>_> *)tail.ptr);
  if (uVar1 == prVar5->tail_len) {
    prVar5 = ref<immutable::rrb<char,_false,_5>_>::operator->
                       ((ref<immutable::rrb<char,_false,_5>_> *)tail.ptr);
    ref<immutable::rrb_details::tree_node<char,false>>::
    ref<immutable::rrb_details::leaf_node<char,false>>
              ((ref<immutable::rrb_details::tree_node<char,false>> *)&local_20,&prVar5->tail);
    prVar5 = ref<immutable::rrb<char,_false,_5>_>::operator->
                       ((ref<immutable::rrb<char,_false,_5>_> *)tail.ptr);
    bVar4 = rrb_details::validate_subtree<char,false,5>(&local_20,prVar5->tail_len,0);
    if (!bVar4) {
      rrb_local._7_1_ = 0;
    }
    ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_20);
    if (bVar4) {
      prVar5 = ref<immutable::rrb<char,_false,_5>_>::operator->
                         ((ref<immutable::rrb<char,_false,_5>_> *)tail.ptr);
      if ((prVar5->root).ptr == (tree_node<char,_false> *)0x0) {
        prVar5 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)tail.ptr);
        uVar1 = prVar5->cnt;
        prVar5 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)tail.ptr);
        if (uVar1 != prVar5->tail_len) {
          prVar5 = ref<immutable::rrb<char,_false,_5>_>::operator->
                             ((ref<immutable::rrb<char,_false,_5>_> *)tail.ptr);
          uVar1 = prVar5->cnt;
          prVar5 = ref<immutable::rrb<char,_false,_5>_>::operator->
                             ((ref<immutable::rrb<char,_false,_5>_> *)tail.ptr);
          printf("Root is null, but the size of the vector (excluding its tail) is %u.\n",
                 (ulong)(uVar1 - prVar5->tail_len));
          rrb_local._7_1_ = 0;
          goto LAB_0017c129;
        }
      }
      else {
        prVar5 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)tail.ptr);
        prVar7 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)tail.ptr);
        uVar1 = prVar7->cnt;
        prVar7 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)tail.ptr);
        uVar3 = prVar7->tail_len;
        prVar7 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)tail.ptr);
        bVar4 = rrb_details::validate_subtree<char,false,5>
                          (&prVar5->root,uVar1 - uVar3,prVar7->shift);
        if (!bVar4) {
          rrb_local._7_1_ = 0;
          goto LAB_0017c129;
        }
      }
      rrb_local._7_1_ = 1;
    }
  }
  else {
    prVar5 = ref<immutable::rrb<char,_false,_5>_>::operator->
                       ((ref<immutable::rrb<char,_false,_5>_> *)tail.ptr);
    plVar6 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&prVar5->tail);
    uVar2 = plVar6->len;
    prVar5 = ref<immutable::rrb<char,_false,_5>_>::operator->
                       ((ref<immutable::rrb<char,_false,_5>_> *)tail.ptr);
    printf("The tail of this rrb-tree says it is of length %u, but the rrb head claims it\nis %u elements long."
           ,(ulong)uVar2,(ulong)prVar5->tail_len);
    rrb_local._7_1_ = 0;
  }
LAB_0017c129:
  return (bool)(rrb_local._7_1_ & 1);
}

Assistant:

bool validate_rrb(const ref<rrb<T, atomic_ref_counting, N>>& rrb)
    {
    using namespace rrb_details;
    // ensure the rrb tree is consistent      
    // the rrb tree should always have a tail
    if (rrb->tail->len != rrb->tail_len)
      {
      printf("The tail of this rrb-tree says it is of length %u, but the rrb head claims it\nis %u elements long.", rrb->tail->len, rrb->tail_len);
      return false;
      }
    else
      {
      ref<tree_node<T, atomic_ref_counting>> tail = rrb->tail;
      if (!validate_subtree<T, atomic_ref_counting, N>(tail, rrb->tail_len, 0))
        return false;
      }
    if (rrb->root.ptr == nullptr)
      {
      if (rrb->cnt - rrb->tail_len != 0)
        {
        printf("Root is null, but the size of the vector (excluding its tail) is %u.\n", rrb->cnt - rrb->tail_len);
        return false;
        }
      }
    else
      {
      if (!validate_subtree<T, atomic_ref_counting, N>(rrb->root, rrb->cnt - rrb->tail_len, rrb->shift))
        return false;
      }
    return true;
    }